

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absVta.c
# Opt level: O0

void Vga_ManPrintCore(Vta_Man_t *p,Vec_Int_t *vCore,int Lift)

{
  int iVar1;
  uint uVar2;
  int iFrame;
  int iObj;
  int Entry;
  int i;
  int Lift_local;
  Vec_Int_t *vCore_local;
  Vta_Man_t *p_local;
  
  for (iObj = 0; iVar1 = Vec_IntSize(vCore), iObj < iVar1; iObj = iObj + 1) {
    uVar2 = Vec_IntEntry(vCore,iObj);
    Abc_Print(1,"%d*%d ",(ulong)(uVar2 & p->nObjMask),
              (ulong)(uint)(((int)uVar2 >> ((byte)p->nObjBits & 0x1f)) + Lift));
  }
  Abc_Print(1,"\n");
  return;
}

Assistant:

void Vga_ManPrintCore( Vta_Man_t * p, Vec_Int_t * vCore, int Lift )
{
    int i, Entry, iObj, iFrame;
    Vec_IntForEachEntry( vCore, Entry, i )
    {
        iObj   = (Entry &  p->nObjMask);
        iFrame = (Entry >> p->nObjBits);
        Abc_Print( 1, "%d*%d ", iObj, iFrame+Lift );
    }
    Abc_Print( 1, "\n" );
}